

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O2

void cmAddLibrary(void *arg,char *libname,int shared,int numSrcs,char **srcs)

{
  ulong uVar1;
  ulong uVar2;
  allocator local_7d;
  int local_7c;
  cmMakefile *local_78;
  char *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs2;
  
  srcs2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  srcs2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  srcs2.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  uVar2 = 0;
  uVar1 = (ulong)(uint)numSrcs;
  if (numSrcs < 1) {
    uVar1 = uVar2;
  }
  local_7c = shared;
  local_78 = (cmMakefile *)arg;
  local_70 = libname;
  for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
    std::__cxx11::string::string((string *)&local_68,srcs[uVar2],&local_7d);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&srcs2,&local_68
              );
    std::__cxx11::string::~string((string *)&local_68);
  }
  std::__cxx11::string::string((string *)&local_68,local_70,&local_7d);
  cmMakefile::AddLibrary(local_78,&local_68,SHARED_LIBRARY - (local_7c == 0),&srcs2,false);
  std::__cxx11::string::~string((string *)&local_68);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&srcs2);
  return;
}

Assistant:

void CCONV cmAddLibrary(void* arg, const char* libname, int shared,
                        int numSrcs, const char** srcs)
{
  cmMakefile* mf = static_cast<cmMakefile*>(arg);
  std::vector<std::string> srcs2;
  int i;
  for (i = 0; i < numSrcs; ++i) {
    srcs2.push_back(srcs[i]);
  }
  mf->AddLibrary(libname, (shared ? cmStateEnums::SHARED_LIBRARY
                                  : cmStateEnums::STATIC_LIBRARY),
                 srcs2);
}